

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

HighsDebugStatus __thiscall HEkk::debugDualSteepestEdgeWeights(HEkk *this,HighsInt alt_debug_level)

{
  vector<double,_std::allocator<double>_> *__x;
  uint sup;
  HighsDebugStatus HVar1;
  uint32_t iRow;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  HVector row_ep;
  undefined1 local_128 [16];
  HVectorBase<double> local_e0;
  
  if (alt_debug_level < 0) {
    alt_debug_level = (this->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  HVar1 = kNotChecked;
  if (1 < alt_debug_level) {
    sup = (this->lp_).num_row_;
    if (alt_debug_level == 2) {
      if ((int)sup < 1) {
        dVar8 = 0.0;
      }
      else {
        dVar8 = 0.0;
        uVar3 = 0;
        do {
          dVar8 = dVar8 + ABS((this->dual_edge_weight_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3]);
          uVar3 = uVar3 + 1;
        } while (sup != uVar3);
      }
      uVar2 = 1;
      if (1 < (int)sup / 10) {
        uVar2 = (int)sup / 10;
      }
      uVar4 = 10;
      if ((int)sup < 100) {
        uVar4 = uVar2;
      }
      local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      HVectorBase<double>::setup(&local_e0,sup);
      uVar2 = 0x1f;
      if (sup - 1 != 0) {
        for (; sup - 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      local_128 = ZEXT816(0);
      uVar5 = uVar4;
      do {
        iRow = 0;
        if (1 < (int)sup) {
          iRow = HighsRandom::drawUniform(&this->random_,sup,(uVar2 ^ 0xffffffe0) + 0x21);
        }
        dVar9 = computeDualSteepestEdgeWeight(this,iRow,&local_e0);
        uVar6 = local_128._12_4_;
        dVar9 = local_128._0_8_ +
                ABS((this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)iRow] - dVar9);
        local_128._8_4_ = local_128._8_4_;
        local_128._0_8_ = dVar9;
        local_128._12_4_ = uVar6;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((pointer)local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      __x = &this->dual_edge_weight_;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_e0,__x);
      computeDualSteepestEdgeWeights(this,false);
      if ((int)sup < 1) {
        dVar9 = 0.0;
        dVar8 = 0.0;
      }
      else {
        dVar9 = 0.0;
        dVar8 = 0.0;
        uVar3 = 0;
        do {
          dVar7 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar3];
          dVar9 = dVar9 + ABS(*(double *)(local_e0._0_8_ + uVar3 * 8) - dVar7);
          dVar8 = dVar8 + ABS(dVar7);
          uVar3 = uVar3 + 1;
        } while (sup != uVar3);
      }
      std::vector<double,_std::allocator<double>_>::operator=
                (__x,(vector<double,_std::allocator<double>_> *)&local_e0);
      uVar4 = sup;
      if ((pointer)local_e0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e0._0_8_);
      }
    }
    dVar7 = dVar9 / dVar8;
    if (this->debug_max_relative_dual_steepest_edge_weight_error * 10.0 < dVar7) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "Call %2d; Tick %8d: ",(ulong)(uint)this->debug_solve_call_num_,
                  (ulong)(uint)this->debug_initial_build_synthetic_tick_);
      local_128._0_4_ = SUB84(dVar9,0);
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  "HEkk::debugDualSteepestEdgeWeights   Iteration %5d: Checked %2d weights: error = %10.4g; norm = %10.4g; relative error = %10.4g\n"
                  ,local_128._0_4_,dVar8,dVar7,(ulong)(uint)this->iteration_count_,(ulong)uVar4);
      fflush(_stdout);
      this->debug_max_relative_dual_steepest_edge_weight_error = dVar7;
      if (0.001 < dVar7) {
        return kLargeError;
      }
    }
    HVar1 = kOk;
  }
  return HVar1;
}

Assistant:

HighsDebugStatus HEkk::debugDualSteepestEdgeWeights(
    const HighsInt alt_debug_level) {
  const HighsInt use_debug_level = alt_debug_level >= 0
                                       ? alt_debug_level
                                       : this->options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsInt num_row = lp.num_row_;
  double dual_steepest_edge_weight_norm = 0;
  double dual_steepest_edge_weight_error = 0;
  HighsInt num_check_weight;
  if (use_debug_level < kHighsDebugLevelExpensive) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      dual_steepest_edge_weight_norm += std::fabs(dual_edge_weight_[iRow]);
    }
    // Just check a few weights
    num_check_weight =
        std::max((HighsInt)1, std::min((HighsInt)10, num_row / 10));
    HVector row_ep;
    row_ep.setup(num_row);
    for (HighsInt iCheck = 0; iCheck < num_check_weight; iCheck++) {
      HighsInt iRow = random_.integer(num_row);
      const double true_weight = computeDualSteepestEdgeWeight(iRow, row_ep);
      dual_steepest_edge_weight_error +=
          std::fabs(this->dual_edge_weight_[iRow] - true_weight);
    }
  } else {
    // Check all weights
    num_check_weight = num_row;
    std::vector<double> updated_dual_edge_weight = this->dual_edge_weight_;
    computeDualSteepestEdgeWeights();
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      dual_steepest_edge_weight_norm +=
          std::fabs(this->dual_edge_weight_[iRow]);
      const double error = std::fabs(updated_dual_edge_weight[iRow] -
                                     this->dual_edge_weight_[iRow]);
      dual_steepest_edge_weight_error += error;
    }
    this->dual_edge_weight_ = updated_dual_edge_weight;
  }
  // Now assess the relative error
  assert(dual_steepest_edge_weight_norm > 0);
  double relative_dual_steepest_edge_weight_error =
      dual_steepest_edge_weight_error / dual_steepest_edge_weight_norm;
  const double large_relative_dual_steepest_edge_weight_error = 1e-3;
  if (relative_dual_steepest_edge_weight_error >
      10 * debug_max_relative_dual_steepest_edge_weight_error) {
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "Call %2d; Tick %8d: ", (int)debug_solve_call_num_,
                debug_initial_build_synthetic_tick_);
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::debugDualSteepestEdgeWeights   Iteration %5d: Checked %2d "
        "weights: "
        "error = %10.4g; norm = %10.4g; relative error = %10.4g\n",
        (int)iteration_count_, (int)num_check_weight,
        dual_steepest_edge_weight_error, dual_steepest_edge_weight_norm,
        relative_dual_steepest_edge_weight_error);
    fflush(stdout);
    debug_max_relative_dual_steepest_edge_weight_error =
        relative_dual_steepest_edge_weight_error;
    if (relative_dual_steepest_edge_weight_error >
        large_relative_dual_steepest_edge_weight_error)
      return HighsDebugStatus::kLargeError;
  }
  return HighsDebugStatus::kOk;
}